

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * duckdb::StringUtil::URLEncode
                   (string *__return_storage_ptr__,string *input,bool encode_slash)

{
  idx_t __n;
  tuple<char_*,_std::default_delete<char[]>_> output;
  unique_ptr<char[],_std::default_delete<char>,_true> result_data;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_30;
  
  __n = URLEncodeSize((input->_M_dataplus)._M_p,input->_M_string_length,encode_slash);
  output.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)operator_new__(__n);
  switchD_0049f7f1::default
            ((void *)output.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl,0,__n);
  local_30._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (tuple<char_*,_std::default_delete<char[]>_>)
       output.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  URLEncodeBuffer((input->_M_dataplus)._M_p,input->_M_string_length,
                  (char *)output.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                          super__Head_base<0UL,_char_*,_false>._M_head_impl,encode_slash);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             output.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl,
             (char *)(__n + (long)output.
                                  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                  super__Head_base<0UL,_char_*,_false>._M_head_impl));
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::URLEncode(const string &input, bool encode_slash) {
	idx_t result_size = URLEncodeSize(input.c_str(), input.size(), encode_slash);
	auto result_data = make_uniq_array<char>(result_size);
	URLEncodeBuffer(input.c_str(), input.size(), result_data.get(), encode_slash);
	return string(result_data.get(), result_size);
}